

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void console_init(int _osc_port)

{
  char cVar1;
  long *plVar2;
  long *plVar3;
  int in_EDI;
  int local_7c;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  if (0 < in_EDI) {
    vera::toString<int>(&local_58,&local_7c);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x2f2acb);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_28 = *plVar3;
      lStack_20 = plVar2[3];
      local_38 = &local_28;
    }
    else {
      local_28 = *plVar3;
      local_38 = (long *)*plVar2;
    }
    local_30 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&cmd_prompt_abi_cxx11_,(string *)&local_38);
    if (local_38 != &local_28) {
      operator_delete(local_38,local_28 + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  initscr();
  cVar1 = has_colors();
  if (cVar1 != '\0') {
    start_color();
    use_default_colors();
    init_pair(1,7,0xffffffff);
    init_pair(2,1,0xffffffff);
    init_pair(3,6,0xffffffff);
    have_colors = true;
  }
  cmd_win = (WINDOW *)newwin(3,_COLS,0,0);
  out_win = (WINDOW *)newwin(_LINES + -3,_COLS,3,0);
  stt_win = (WINDOW *)newwin(_LINES,stt_width,0,_COLS - stt_width);
  raw();
  cbreak();
  cbreak();
  noecho();
  scrollok(out_win,1);
  idlok(out_win,0);
  keypad(_stdscr,1);
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::ios::rdbuf((streambuf *)((long)&std::cerr + *(long *)(std::cerr + -0x18)));
  console_refresh();
  return;
}

Assistant:

void console_init(int _osc_port) {

    #if defined(SUPPORT_NCURSES)

    if (_osc_port > 0)
        cmd_prompt = "osc://localhost:" + vera::toString(_osc_port) + " ";

    initscr();
    if (has_colors()) {
        start_color();
        use_default_colors();

        // init_color(COLOR_MAGENTA, 1000, 100, 100);
        // init_color(COLOR_YELLOW, 800, 800, 800);
        // init_color(COLOR_GREEN, 600, 600, 600);
        // init_color(COLOR_BLUE, 400, 400, 400);
        // init_pair(1, COLOR_WHITE, -1);
        // init_pair(2, COLOR_YELLOW, -1);
        // init_pair(3, COLOR_MAGENTA, -1);
        // init_pair(4, COLOR_GREEN, -1);
        // init_pair(5, COLOR_BLUE, -1);

        init_pair(1, COLOR_WHITE, -1);
        init_pair(2, COLOR_RED, -1);
        init_pair(3, COLOR_CYAN, -1);

        have_colors = true;
    }

    // Create windows
    cmd_win = newwin(3, COLS, 0, 0);
    out_win = newwin(LINES-3, COLS, 3, 0);
    stt_win = newwin(LINES, stt_width, 0, COLS - stt_width);

    raw();
    crmode();
    cbreak();
    noecho();
    scrollok(out_win, true);
    idlok(out_win, false);

    //  // mouse capture
    // captureMouse(true);

    // Capture Keys
    keypad(stdscr, true);

    // Capture all standard console OUT and ERR
    std::streambuf * old_cout = std::cout.rdbuf(buffer_cout.rdbuf());
    std::streambuf * old_cerr = std::cerr.rdbuf(buffer_cerr.rdbuf());

    console_refresh();
    #endif
}